

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall wave::File::Impl::set_current_sample_index(Impl *this,uint64_t sample_idx)

{
  ulong uVar1;
  undefined1 local_30 [8];
  streampos stream_index;
  int bytes_per_sample;
  uint16_t bits_per_sample;
  uint64_t sample_idx_local;
  Impl *this_local;
  
  stream_index._M_state.__value.__wch._2_2_ = (this->header).fmt.bits_per_sample;
  stream_index._M_state.__count = ZEXT24(stream_index._M_state.__value.__wch._2_2_) / 8;
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)local_30,
             this->data_offset_ + sample_idx * (long)stream_index._M_state.__count);
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::ifstream::is_open();
    if ((uVar1 & 1) != 0) {
      std::istream::seekg(this,local_30,stream_index._M_off);
    }
  }
  else {
    std::ostream::seekp(&this->ostream,local_30,stream_index._M_off);
  }
  return;
}

Assistant:

void set_current_sample_index(uint64_t sample_idx) {
    auto bits_per_sample = header.fmt.bits_per_sample;
    auto bytes_per_sample = bits_per_sample / 8;

    std::streampos stream_index =
        data_offset_ + (sample_idx * bytes_per_sample);
    if (ostream.is_open()) {
      ostream.seekp(stream_index);
    } else if (istream.is_open()) {
      istream.seekg(stream_index);
    }
  }